

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

int __thiscall antlr::TokenBuffer::LA(TokenBuffer *this,uint i)

{
  int iVar1;
  TokenRefCount<antlr::Token> local_18;
  
  fill(this,i);
  local_18.ref = (this->queue).storage.
                 super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [(this->queue).m_offset + (ulong)((this->markerOffset + i) - 1)].ref;
  (local_18.ref)->count = (local_18.ref)->count + 1;
  iVar1 = (*(local_18.ref)->ptr->_vptr_Token[6])();
  TokenRefCount<antlr::Token>::~TokenRefCount(&local_18);
  return iVar1;
}

Assistant:

int TokenBuffer::LA(unsigned int i)
{
	fill(i);
	return queue.elementAt(markerOffset+i-1)->getType();
}